

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

float stbir__filter_triangle(float x,float s)

{
  return (float)(~-(uint)(1.0 < ABS(x)) & (uint)(1.0 - ABS(x)));
}

Assistant:

static float stbir__filter_triangle(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x <= 1.0f)
        return 1 - x;
    else
        return 0;
}